

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O3

void LJ_Update_Velocity(void)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  double *v;
  double *a;
  int ld;
  int hi;
  int lo;
  long local_38;
  long local_30;
  int local_24;
  int local_20;
  int local_1c;
  
  GA_Sync();
  NGA_Distribution(g_V,gMe,&local_1c,&local_20);
  NGA_Access(g_V,&local_1c,&local_20,&local_38,&local_24);
  NGA_Access(g_G,&local_1c,&local_20,&local_30,&local_24);
  uVar1 = (local_20 - local_1c) + 1;
  if (2 < (int)uVar1) {
    uVar2 = 0;
    do {
      lVar3 = 0;
      do {
        *(double *)(local_38 + lVar3 * 8) =
             *(double *)(local_30 + lVar3 * 8) * 0.5 * gTimeStep + *(double *)(local_38 + lVar3 * 8)
        ;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uVar2 = uVar2 + 1;
      local_38 = local_38 + 0x18;
      local_30 = local_30 + 0x18;
    } while (uVar2 != (ulong)uVar1 / 3);
  }
  GA_Sync();
  return;
}

Assistant:

void LJ_Update_Velocity() {
  int i, p, lo, hi, ld, natms;
  double *a, *v;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld); 
  NGA_Access(g_G, &lo, &hi, &a, &ld); 
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) 
      v[p*NDIM+i] += 0.5 * a[p*NDIM+i] * gTimeStep;

  GA_Sync();
}